

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

void Gia_ObjCollectInternalCut_rec(Gia_Man_t *p,int iObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjHasNumId(p,iObj);
  if (iVar1 == 0) {
    pGVar2 = Gia_ManObj(p,iObj);
    iVar1 = Gia_ObjIsAnd(pGVar2);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p, iObj))",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                    ,0x16c,"void Gia_ObjCollectInternalCut_rec(Gia_Man_t *, int)");
    }
    pGVar2 = Gia_ManObj(p,iObj);
    iVar1 = Gia_ObjFaninId0(pGVar2,iObj);
    Gia_ObjCollectInternalCut_rec(p,iVar1);
    pGVar2 = Gia_ManObj(p,iObj);
    iVar1 = Gia_ObjFaninId1(pGVar2,iObj);
    Gia_ObjCollectInternalCut_rec(p,iVar1);
    iVar1 = Vec_IntSize(p->vTtNodes);
    Gia_ObjSetNumId(p,iObj,iVar1);
    Vec_IntPush(p->vTtNodes,iObj);
  }
  return;
}

Assistant:

void Gia_ObjCollectInternalCut_rec( Gia_Man_t * p, int iObj )
{
    if ( Gia_ObjHasNumId(p, iObj) )
        return;
    assert( Gia_ObjIsAnd(Gia_ManObj(p, iObj)) );
    Gia_ObjCollectInternalCut_rec( p, Gia_ObjFaninId0(Gia_ManObj(p, iObj), iObj) );
    Gia_ObjCollectInternalCut_rec( p, Gia_ObjFaninId1(Gia_ManObj(p, iObj), iObj) );
    Gia_ObjSetNumId( p, iObj, Vec_IntSize(p->vTtNodes) );
    Vec_IntPush( p->vTtNodes, iObj );
}